

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::BasicOneWorkGroup::RunIteration
          (BasicOneWorkGroup *this,int param_1,int param_2,int param_3,GLuint binding,
          bool dispatch_indirect)

{
  CallLogWrapper *this_00;
  GLuint *buffers;
  bool bVar1;
  GLuint GVar2;
  ostream *poVar3;
  void *pvVar4;
  long lVar5;
  bool *compile_error;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  GLuint num_groups [3];
  GLint v [3];
  bool local_1fc;
  string local_1e8;
  ulong local_1c8;
  long local_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  undefined1 local_1a8 [376];
  
  if (this->m_program != 0) {
    glu::CallLogWrapper::glDeleteProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\nlayout(local_size_x = ",0x17);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,param_1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", local_size_y = ",0x11);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", local_size_z = ",0x11);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") in;\nlayout(std430, binding = ",0x1f)
  ;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             ") buffer Output {\n  uvec4 local_id[];\n} g_out;\nvoid main() {\n  if (gl_WorkGroupSize == uvec3("
             ,0x5d);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,param_3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,
             ") && gl_WorkGroupID == uvec3(0) &&\n      gl_GlobalInvocationID == gl_LocalInvocationID) {\n    g_out.local_id[gl_LocalInvocationIndex] = uvec4(gl_LocalInvocationID, 0);\n  } else {\n    g_out.local_id[gl_LocalInvocationIndex] = uvec4(0xffff);\n  }\n}"
             ,0xf5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_1e8);
  this->m_program = GVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    GVar2 = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,GVar2);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  if (bVar1) {
    glu::CallLogWrapper::glGetProgramiv(this_00,this->m_program,0x8267,&local_1b8);
    if (local_1b0 == param_3 && (local_1b4 == param_2 && local_1b8 == param_1)) {
      local_1c8 = (ulong)(uint)(param_2 * param_1);
      buffers = &this->m_storage_buffer;
      GVar2 = this->m_storage_buffer;
      if (GVar2 == 0) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,buffers);
        GVar2 = *buffers;
      }
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,binding,GVar2);
      lVar8 = (ulong)(uint)(param_2 * param_1 * param_3) << 4;
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,lVar8,(void *)0x0,0x88e8);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      if (dispatch_indirect) {
        local_1e8._M_dataplus._M_p = &DAT_100000001;
        local_1e8._M_string_length._0_4_ = 1;
        GVar2 = this->m_dispatch_buffer;
        if (GVar2 == 0) {
          glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_dispatch_buffer);
          GVar2 = this->m_dispatch_buffer;
        }
        glu::CallLogWrapper::glBindBuffer(this_00,0x90ee,GVar2);
        glu::CallLogWrapper::glBufferData(this_00,0x90ee,0xc,&local_1e8,0x88e4);
        glu::CallLogWrapper::glDispatchComputeIndirect(this_00,0);
      }
      else {
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      }
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,*buffers);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      iVar7 = 0;
      pvVar4 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,lVar8,1);
      if (param_3 < 1) {
        local_1fc = true;
      }
      else {
        local_1fc = true;
        lVar8 = 0;
        do {
          local_1c0 = lVar8;
          if (0 < param_2) {
            iVar6 = 0;
            do {
              if (0 < param_1) {
                uVar9 = 0;
                do {
                  lVar5 = (long)((int)lVar8 + (int)uVar9) * 0x10;
                  if ((((uVar9 != *(uint *)((long)pvVar4 + lVar5)) ||
                       (*(int *)((long)pvVar4 + lVar5 + 4) != iVar6)) ||
                      (*(int *)((long)pvVar4 + lVar5 + 8) != iVar7)) ||
                     (*(int *)((long)pvVar4 + lVar5 + 0xc) != 0)) {
                    local_1fc = false;
                    anon_unknown_0::Output
                              ("Invalid data at offset %d.\n",(ulong)(uint)((int)lVar8 + (int)uVar9)
                              );
                  }
                  uVar9 = uVar9 + 1;
                } while ((uint)param_1 != uVar9);
              }
              iVar6 = iVar6 + 1;
              lVar8 = lVar8 + (ulong)(uint)param_1;
            } while (iVar6 != param_2);
          }
          iVar7 = iVar7 + 1;
          lVar8 = local_1c0 + local_1c8;
        } while (iVar7 != param_3);
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    }
    else {
      local_1fc = false;
      anon_unknown_0::Output("GL_COMPUTE_LOCAL_WORK_SIZE is (%d %d %d) should be (%d %d %d)\n");
    }
  }
  else {
    local_1fc = false;
  }
  return local_1fc;
}

Assistant:

bool RunIteration(int local_size_x, int local_size_y, int local_size_z, GLuint binding, bool dispatch_indirect)
	{
		if (m_program != 0)
			glDeleteProgram(m_program);
		m_program = CreateComputeProgram(GenSource(local_size_x, local_size_y, local_size_z, binding));
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return false;

		GLint v[3];
		glGetProgramiv(m_program, GL_COMPUTE_WORK_GROUP_SIZE, v);
		if (v[0] != local_size_x || v[1] != local_size_y || v[2] != local_size_z)
		{
			Output("GL_COMPUTE_LOCAL_WORK_SIZE is (%d %d %d) should be (%d %d %d)\n", v[0], v[1], v[2], local_size_x,
				   local_size_y, local_size_z);
			return false;
		}

		const int kSize = local_size_x * local_size_y * local_size_z;

		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, binding, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(uvec4) * kSize, NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint num_groups[3] = { 1, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(num_groups), num_groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}

		uvec4* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data =
			static_cast<uvec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * sizeof(uvec4), GL_MAP_READ_BIT));

		bool ret = true;

		for (int z = 0; z < local_size_z; ++z)
		{
			for (int y = 0; y < local_size_y; ++y)
			{
				for (int x = 0; x < local_size_x; ++x)
				{
					const int index = z * local_size_x * local_size_y + y * local_size_x + x;
					if (!IsEqual(data[index], uvec4(x, y, z, 0)))
					{
						Output("Invalid data at offset %d.\n", index);
						ret = false;
					}
				}
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);
		return ret;
	}